

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_textedit.h
# Opt level: O1

ImWchar * ImGuiStb::stb_text_createundo(StbUndoState *state,int pos,int insert_len,int delete_len)

{
  short sVar1;
  StbUndoRecord *pSVar2;
  
  state->redo_point = 99;
  state->redo_char_point = 999;
  if (state->undo_point == 99) {
    stb_textedit_discard_undo(state);
  }
  if (insert_len < 1000) {
    sVar1 = state->undo_char_point;
    while (999 < sVar1 + insert_len) {
      stb_textedit_discard_undo(state);
      sVar1 = state->undo_char_point;
    }
    sVar1 = state->undo_point;
    state->undo_point = sVar1 + 1;
    pSVar2 = state->undo_rec + sVar1;
  }
  else {
    pSVar2 = (StbUndoRecord *)0x0;
    state->undo_point = 0;
    state->undo_char_point = 0;
  }
  if (pSVar2 != (StbUndoRecord *)0x0) {
    pSVar2->where = pos;
    pSVar2->insert_length = (short)insert_len;
    pSVar2->delete_length = (short)delete_len;
    if (insert_len != 0) {
      sVar1 = state->undo_char_point;
      pSVar2->char_storage = sVar1;
      state->undo_char_point = (short)insert_len + sVar1;
      return state->undo_char + sVar1;
    }
    pSVar2->char_storage = -1;
  }
  return (ImWchar *)0x0;
}

Assistant:

static STB_TEXTEDIT_CHARTYPE *stb_text_createundo(StbUndoState *state, int pos, int insert_len, int delete_len)
{
   StbUndoRecord *r = stb_text_create_undo_record(state, insert_len);
   if (r == NULL)
      return NULL;

   r->where = pos;
   r->insert_length = (short) insert_len;
   r->delete_length = (short) delete_len;

   if (insert_len == 0) {
      r->char_storage = -1;
      return NULL;
   } else {
      r->char_storage = state->undo_char_point;
      state->undo_char_point = state->undo_char_point + (short) insert_len;
      return &state->undo_char[r->char_storage];
   }
}